

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regerror.c
# Opt level: O0

size_t regerror(int __errcode,regex_t *__preg,char *__errbuf,size_t __errbuf_size)

{
  int iVar1;
  char local_78 [4];
  int target;
  char convbuf [50];
  rerr *local_38;
  rerr *r;
  size_t errbuf_size_local;
  char *errbuf_local;
  regex_t *preg_local;
  size_t sStack_10;
  int errorcode_local;
  
  if (__errcode == 0xff) {
    if ((__preg == (regex_t *)0x0) || (__preg->used == 0)) {
      sStack_10 = set_result(__errbuf,__errbuf_size,"0");
    }
    else {
      local_38 = rerrs;
      while ((-1 < local_38->code &&
             (iVar1 = strcmp(local_38->name,(char *)__preg->used), iVar1 != 0))) {
        local_38 = local_38 + 1;
      }
      if (local_38->code < 0) {
        sStack_10 = set_result(__errbuf,__errbuf_size,"0");
      }
      else {
        snprintf(local_78,0x32,"%d",(ulong)(uint)local_38->code);
        sStack_10 = set_result(__errbuf,__errbuf_size,local_78);
      }
    }
  }
  else {
    for (local_38 = rerrs; (-1 < local_38->code && (local_38->code != (__errcode & 0xfffffeffU)));
        local_38 = local_38 + 1) {
    }
    if ((__errcode & 0x100U) == 0) {
      sStack_10 = set_result(__errbuf,__errbuf_size,local_38->explain);
    }
    else if (local_38->code < 0) {
      snprintf(local_78,0x32,"REG_0x%x",(ulong)(__errcode & 0xfffffeffU));
      sStack_10 = set_result(__errbuf,__errbuf_size,local_78);
    }
    else {
      sStack_10 = set_result(__errbuf,__errbuf_size,local_38->name);
    }
  }
  return sStack_10;
}

Assistant:

size_t
regerror(int errorcode, const regex_t *preg, char *errbuf, size_t errbuf_size)
{
	struct rerr *r;
	char convbuf[50];

	if (errorcode == REG_ATOI) {
		if (preg == NULL || preg->re_endp == NULL)
			return set_result(errbuf, errbuf_size, "0");
		for (r = rerrs; r->code >= 0; r++)
			if (strcmp(r->name, preg->re_endp) == 0)
				break;
		if (r->code < 0)
			return set_result(errbuf, errbuf_size, "0");
		snprintf(convbuf, sizeof convbuf, "%d", r->code);
		return set_result(errbuf, errbuf_size, convbuf);
	}
	else {
		int target = errorcode &~ REG_ITOA;
		
		for (r = rerrs; r->code >= 0; r++)
			if (r->code == target)
				break;
		if (errorcode & REG_ITOA) {
			if (r->code >= 0)
				return set_result(errbuf, errbuf_size, r->name);
			snprintf(convbuf, sizeof convbuf, "REG_0x%x", target);
			return set_result(errbuf, errbuf_size, convbuf);
		}
		return set_result(errbuf, errbuf_size, r->explain);
	}
}